

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

ItemSource * __thiscall
WorldShuffler::place_item_randomly
          (WorldShuffler *this,Item *item,
          vector<ItemSource_*,_std::allocator<ItemSource_*>_> *possible_sources)

{
  bool bVar1;
  mapped_type_conflict2 *pmVar2;
  reference ppIVar3;
  LandstalkerException *this_00;
  string *__rhs;
  size_type __val;
  uint8_t local_139;
  Item **local_138;
  Item **local_130;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_128;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_120;
  const_iterator local_118;
  undefined1 local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ItemSource *local_58;
  ItemSource *source;
  iterator __end1;
  iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  ItemSource *picked_item_source;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *local_28;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *possible_sources_local;
  Item *item_local;
  WorldShuffler *this_local;
  
  local_28 = possible_sources;
  possible_sources_local = (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)item;
  item_local = (Item *)this;
  picked_item_source._7_1_ = Item::id(item);
  pmVar2 = std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::operator[](&this->_item_pool_quantities,
                        (key_type_conflict *)((long)&picked_item_source + 7));
  if (*pmVar2 == 0) {
    this_local = (WorldShuffler *)0x0;
  }
  else {
    vectools::shuffle<ItemSource*>(possible_sources,&this->_rng);
    __range1 = (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)0x0;
    __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(possible_sources);
    source = (ItemSource *)
             std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(possible_sources);
    while (bVar1 = __gnu_cxx::
                   operator==<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                             (&__end1,(__normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                       *)&source), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                ::operator*(&__end1);
      local_58 = *ppIVar3;
      bVar1 = ItemSource::empty(local_58);
      if ((bVar1) &&
         (bVar1 = test_item_source_compatibility(this,local_58,(Item *)possible_sources_local),
         bVar1)) {
        (*local_58->_vptr_ItemSource[3])(local_58,possible_sources_local);
        __range1 = (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)local_58;
        break;
      }
      __gnu_cxx::
      __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>::
      operator++(&__end1);
    }
    if (__range1 == (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)0x0) {
      local_109 = 1;
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      __rhs = Item::name_abi_cxx11_((Item *)possible_sources_local);
      std::operator+(&local_d8,"Could not place ",__rhs);
      std::operator+(&local_b8,&local_d8," in any of the ");
      __val = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::size(possible_sources);
      std::__cxx11::to_string(&local_108,__val);
      std::operator+(&local_98,&local_b8,&local_108);
      std::operator+(&local_78,&local_98," possible sources.");
      LandstalkerException::LandstalkerException(this_00,&local_78);
      local_109 = 0;
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    local_128._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::begin(&this->_item_pool);
    local_130 = (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end(&this->_item_pool);
    local_120 = std::
                find<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,Item*>
                          (local_128,
                           (__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                            )local_130,(Item **)&possible_sources_local);
    __gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>::
    __normal_iterator<Item**>
              ((__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>> *)&local_118
               ,&local_120);
    local_138 = (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::erase
                                   (&this->_item_pool,local_118);
    local_139 = Item::id((Item *)possible_sources_local);
    pmVar2 = std::
             map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
             ::operator[](&this->_item_pool_quantities,&local_139);
    *pmVar2 = *pmVar2 - 1;
    this_local = (WorldShuffler *)__range1;
  }
  return (ItemSource *)this_local;
}

Assistant:

ItemSource* WorldShuffler::place_item_randomly(Item* item, std::vector<ItemSource*> possible_sources)
{
    if(_item_pool_quantities[item->id()] == 0)
        return nullptr;

    vectools::shuffle(possible_sources, _rng);

    ItemSource* picked_item_source = nullptr;
    for(ItemSource* source : possible_sources)
    {
        if(source->empty() && test_item_source_compatibility(source, item))
        {
            source->item(item);
            picked_item_source = source;
            break;
        }
    }

    if(!picked_item_source)
    {
        throw LandstalkerException("Could not place " + item->name() + " in any of the "
                                   + std::to_string(possible_sources.size()) + " possible sources.");
    }

    _item_pool.erase(std::find(_item_pool.begin(), _item_pool.end(), item));
    _item_pool_quantities[item->id()] -= 1;
    return picked_item_source;
}